

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void mbedtls_sha512_starts(mbedtls_sha512_context *ctx,int is384)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  
  ctx->total[0] = 0;
  ctx->total[1] = 0;
  if (is384 == 0) {
    uVar1 = 0xfb41bd6b;
    uVar2 = 0x1f83d9ab;
    uVar3 = 0x137e2179;
    uVar4 = 0x5be0cd19;
    uVar5 = 0xade682d1;
    uVar6 = 0x510e527f;
    uVar7 = 0x2b3e6c1f;
    uVar8 = 0x9b05688c;
    uVar9 = 0xfe94f82b;
    uVar10 = 0x3c6ef372;
    uVar11 = 0x5f1d36f1;
    uVar12 = 0xa54ff53a;
    uVar13 = 0xf3bcc908;
    uVar14 = 0x6a09e667;
    uVar15 = 0x84caa73b;
    uVar16 = 0xbb67ae85;
  }
  else {
    uVar1 = 0x64f98fa7;
    uVar2 = 0xdb0c2e0d;
    uVar3 = 0xbefa4fa4;
    uVar4 = 0x47b5481d;
    uVar5 = 0xffc00b31;
    uVar6 = 0x67332667;
    uVar7 = 0x68581511;
    uVar8 = 0x8eb44a87;
    uVar9 = 0x3070dd17;
    uVar10 = 0x9159015a;
    uVar11 = 0xf70e5939;
    uVar12 = 0x152fecd8;
    uVar13 = 0xc1059ed8;
    uVar14 = 0xcbbb9d5d;
    uVar15 = 0x367cd507;
    uVar16 = 0x629a292a;
  }
  *(undefined4 *)ctx->state = uVar13;
  *(undefined4 *)((long)ctx->state + 4) = uVar14;
  *(undefined4 *)(ctx->state + 1) = uVar15;
  *(undefined4 *)((long)ctx->state + 0xc) = uVar16;
  *(undefined4 *)(ctx->state + 2) = uVar9;
  *(undefined4 *)((long)ctx->state + 0x14) = uVar10;
  *(undefined4 *)(ctx->state + 3) = uVar11;
  *(undefined4 *)((long)ctx->state + 0x1c) = uVar12;
  *(undefined4 *)(ctx->state + 4) = uVar5;
  *(undefined4 *)((long)ctx->state + 0x24) = uVar6;
  *(undefined4 *)(ctx->state + 5) = uVar7;
  *(undefined4 *)((long)ctx->state + 0x2c) = uVar8;
  *(undefined4 *)(ctx->state + 6) = uVar1;
  *(undefined4 *)((long)ctx->state + 0x34) = uVar2;
  *(undefined4 *)(ctx->state + 7) = uVar3;
  *(undefined4 *)((long)ctx->state + 0x3c) = uVar4;
  ctx->is384 = is384;
  return;
}

Assistant:

void mbedtls_sha512_starts( mbedtls_sha512_context *ctx, int is384 )
{
    ctx->total[0] = 0;
    ctx->total[1] = 0;

    if( is384 == 0 )
    {
        /* SHA-512 */
        ctx->state[0] = UL64(0x6A09E667F3BCC908);
        ctx->state[1] = UL64(0xBB67AE8584CAA73B);
        ctx->state[2] = UL64(0x3C6EF372FE94F82B);
        ctx->state[3] = UL64(0xA54FF53A5F1D36F1);
        ctx->state[4] = UL64(0x510E527FADE682D1);
        ctx->state[5] = UL64(0x9B05688C2B3E6C1F);
        ctx->state[6] = UL64(0x1F83D9ABFB41BD6B);
        ctx->state[7] = UL64(0x5BE0CD19137E2179);
    }
    else
    {
        /* SHA-384 */
        ctx->state[0] = UL64(0xCBBB9D5DC1059ED8);
        ctx->state[1] = UL64(0x629A292A367CD507);
        ctx->state[2] = UL64(0x9159015A3070DD17);
        ctx->state[3] = UL64(0x152FECD8F70E5939);
        ctx->state[4] = UL64(0x67332667FFC00B31);
        ctx->state[5] = UL64(0x8EB44A8768581511);
        ctx->state[6] = UL64(0xDB0C2E0D64F98FA7);
        ctx->state[7] = UL64(0x47B5481DBEFA4FA4);
    }

    ctx->is384 = is384;
}